

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O2

char * Abc_SopFromTruthHex(char *pTruth)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  size_t sVar4;
  Vec_Int_t *p;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  char *pcVar13;
  
  pcVar6 = pTruth;
  sVar4 = strlen(pTruth);
  uVar10 = (uint)pcVar6;
  uVar3 = (uint)sVar4;
  if ((int)uVar3 < 2) {
    uVar9 = 2;
  }
  else {
    uVar10 = uVar3;
    iVar11 = Abc_Base2Log(uVar3);
    uVar9 = iVar11 + 2;
  }
  if (1 << ((char)uVar9 - 2U & 0x1f) == uVar3) {
    p = Vec_IntAlloc(uVar10);
    uVar12 = 0;
    uVar5 = 0;
    if (0 < (int)uVar3) {
      uVar5 = sVar4 & 0xffffffff;
    }
    iVar11 = uVar3 * 4;
    for (; iVar11 = iVar11 + -4, uVar12 != uVar5; uVar12 = uVar12 + 1) {
      cVar1 = pTruth[uVar12];
      bVar2 = cVar1 - 0x30;
      if (9 < bVar2) {
        if ((byte)(cVar1 + 0x9fU) < 6) {
          bVar2 = cVar1 + 0xa9;
        }
        else {
          if (5 < (byte)(cVar1 + 0xbfU)) {
            printf("String %s does not look like a hexadecimal representation of the truth table.\n"
                   ,pTruth);
            return (char *)0x0;
          }
          bVar2 = cVar1 - 0x37;
        }
      }
      for (uVar10 = 0; uVar10 != 4; uVar10 = uVar10 + 1) {
        if ((bVar2 >> (uVar10 & 0x1f) & 1) != 0) {
          Vec_IntPush(p,iVar11 + uVar10);
        }
      }
    }
    uVar10 = p->nSize;
    iVar11 = uVar9 + 3;
    pcVar6 = (char *)malloc((long)(int)(uVar10 * iVar11 + 1));
    pcVar6[(int)(uVar10 * iVar11)] = '\0';
    uVar12 = 0;
    uVar5 = (ulong)uVar9;
    if ((int)uVar9 < 1) {
      uVar5 = uVar12;
    }
    if ((int)uVar10 < 1) {
      uVar10 = 0;
    }
    pcVar13 = pcVar6;
    for (; uVar12 != uVar10; uVar12 = uVar12 + 1) {
      uVar3 = Vec_IntEntry(p,(int)uVar12);
      lVar7 = uVar12 * (long)iVar11;
      for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
        pcVar13[uVar8] = (uVar3 >> ((uint)uVar8 & 0x1f) & 1) == 0 ^ 0x31;
      }
      (pcVar6 + (int)uVar9 + lVar7)[0] = ' ';
      (pcVar6 + (int)uVar9 + lVar7)[1] = '1';
      pcVar6[(long)(int)uVar9 + lVar7 + 2] = '\n';
      pcVar13 = pcVar13 + iVar11;
    }
    Vec_IntFree(p);
  }
  else {
    pcVar6 = (char *)0x0;
    printf("String %s does not look like a truth table of a %d-variable function.\n",pTruth,
           (ulong)uVar9);
  }
  return pcVar6;
}

Assistant:

char * Abc_SopFromTruthHex( char * pTruth )
{
    char * pSopCover, * pCube;
    int nTruthSize, nVars, Digit, Length, Mint, i, b;
    Vec_Int_t * vMints;

    // get the number of variables
    nTruthSize = strlen(pTruth);
    nVars = (nTruthSize < 2) ? 2 : Abc_Base2Log(nTruthSize) + 2;
    if ( nTruthSize != (1 << (nVars-2)) )
    {
        printf( "String %s does not look like a truth table of a %d-variable function.\n", pTruth, nVars );
        return NULL;
    }

    // collect the on-set minterms
    vMints = Vec_IntAlloc( 100 );
    for ( i = 0; i < nTruthSize; i++ )
    {
        if ( pTruth[i] >= '0' && pTruth[i] <= '9' )
            Digit = pTruth[i] - '0';
        else if ( pTruth[i] >= 'a' && pTruth[i] <= 'f' )
            Digit = 10 + pTruth[i] - 'a';
        else if ( pTruth[i] >= 'A' && pTruth[i] <= 'F' )
            Digit = 10 + pTruth[i] - 'A';
        else
        {
            printf( "String %s does not look like a hexadecimal representation of the truth table.\n", pTruth );
            return NULL;
        }
        for ( b = 0; b < 4; b++ )
            if ( Digit & (1 << b) )
                Vec_IntPush( vMints, 4*(nTruthSize-1-i)+b );
    }

    // create the SOP representation of the minterms
    Length = Vec_IntSize(vMints) * (nVars + 3);
    pSopCover = ABC_ALLOC( char, Length + 1 );
    pSopCover[Length] = 0;
    Vec_IntForEachEntry( vMints, Mint, i )
    {
        pCube = pSopCover + i * (nVars + 3);
        for ( b = 0; b < nVars; b++ )
//            if ( Mint & (1 << (nVars-1-b)) )
            if ( Mint & (1 << b) )
                pCube[b] = '1';
            else
                pCube[b] = '0';
        pCube[nVars + 0] = ' ';
        pCube[nVars + 1] = '1';
        pCube[nVars + 2] = '\n';
    }
/*
    // create TT representation
    {
        extern void Bdc_ManDecomposeTest( unsigned uTruth, int nVars );
        unsigned uTruth = 0;
        int nVarsAll = 4;
        assert( nVarsAll == 4 );
        assert( nVars <= nVarsAll );
        Vec_IntForEachEntry( vMints, Mint, i )
            uTruth |= (1 << Mint);
//        uTruth = uTruth | (uTruth << 8) | (uTruth << 16) | (uTruth << 24);
        uTruth = uTruth | (uTruth << 16);
        Bdc_ManDecomposeTest( uTruth, nVarsAll );
    }
*/
    Vec_IntFree( vMints );
    return pSopCover;
}